

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QCss::Declaration>::moveAppend
          (QGenericArrayOps<QCss::Declaration> *this,Declaration *b,Declaration *e)

{
  qsizetype *pqVar1;
  Declaration *pDVar2;
  long lVar3;
  DeclarationData *pDVar4;
  
  if (b != e) {
    pDVar2 = (this->super_QArrayDataPointer<QCss::Declaration>).ptr;
    for (; b < e; b = b + 1) {
      lVar3 = (this->super_QArrayDataPointer<QCss::Declaration>).size;
      pDVar4 = (b->d).d.ptr;
      (b->d).d.ptr = (DeclarationData *)0x0;
      pDVar2[lVar3].d.d.ptr = pDVar4;
      pqVar1 = &(this->super_QArrayDataPointer<QCss::Declaration>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }